

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.cpp
# Opt level: O0

void duckdb::DiscreteAverageOperation::Finalize<long,duckdb::AvgState<duckdb::hugeint_t>>
               (AvgState<duckdb::hugeint_t> *state,long *target,AggregateFinalizeData *finalize_data
               )

{
  hugeint_t input;
  bool bVar1;
  long lVar2;
  long *in_RSI;
  long *in_RDI;
  hugeint_t remainder;
  hugeint_t *in_stack_000000a0;
  undefined1 in_stack_000000a8 [16];
  undefined1 in_stack_000000b8 [16];
  uint64_t in_stack_ffffffffffffffa8;
  hugeint_t *in_stack_ffffffffffffffb0;
  hugeint_t *rhs;
  hugeint_t *this;
  AggregateFinalizeData *in_stack_ffffffffffffffe0;
  
  if (*in_RDI == 0) {
    AggregateFinalizeData::ReturnNull(in_stack_ffffffffffffffe0);
  }
  else {
    rhs = (hugeint_t *)in_RDI[1];
    this = (hugeint_t *)in_RDI[2];
    hugeint_t::hugeint_t(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    Hugeint::DivMod((hugeint_t)in_stack_000000b8,(hugeint_t)in_stack_000000a8,in_stack_000000a0);
    input.upper = (int64_t)in_stack_ffffffffffffffb0;
    input.lower = in_stack_ffffffffffffffa8;
    lVar2 = Hugeint::Cast<long>(input);
    *in_RSI = lVar2;
    hugeint_t::hugeint_t(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    bVar1 = hugeint_t::operator>(this,rhs);
    *in_RSI = (ulong)bVar1 + *in_RSI;
  }
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.count == 0) {
			finalize_data.ReturnNull();
		} else {
			hugeint_t remainder;
			target = Hugeint::Cast<T>(Hugeint::DivMod(state.value, state.count, remainder));
			// Round the result
			target += (remainder > (state.count / 2));
		}
	}